

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O3

bool __thiscall
Sudoku::columnCheck(Sudoku *this,
                   list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *furtherWays_,
                   vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                   *testFields,bool recordFullFurtherWays,bool debug)

{
  int *piVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int i;
  uint local_70;
  Way local_50;
  list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *local_38;
  
  iVar4 = this->squared_size_;
  uVar5 = 0;
  local_38 = furtherWays_;
  if (0 < iVar4) {
    do {
      if (0 < iVar4) {
        i = 1;
        do {
          if (0 < iVar4) {
            uVar8 = 0;
            local_70 = 0;
            uVar9 = 0;
            do {
              iVar4 = (*this->_vptr_Sudoku[7])(this,(ulong)uVar5,uVar8);
              iVar4 = Field::value((testFields->
                                   super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[iVar4].
                                   super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
              if (iVar4 == i) goto LAB_0010c7a3;
              iVar4 = (*this->_vptr_Sudoku[7])(this,(ulong)uVar5,uVar8);
              bVar3 = Field::valuePossible
                                ((testFields->
                                 super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[iVar4].
                                 super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,i);
              uVar9 = uVar9 + bVar3;
              if (1 < uVar9) goto LAB_0010c7a3;
              if (bVar3) {
                local_70 = (uint)uVar8;
              }
              uVar7 = (uint)uVar8 + 1;
              uVar8 = (ulong)uVar7;
            } while ((int)uVar7 < this->squared_size_);
            if (uVar9 == 1) {
              if (debug) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Column check (column ",0x15);
                poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"): value ",9);
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,i);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar6," has to be in field (",0x15);
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_70);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->current_z_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                std::ostream::put((char)poVar6);
                std::ostream::flush();
              }
              p_Var2 = (local_38->
                       super__List_base<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_>).
                       _M_impl._M_node.super__List_node_base._M_prev;
              piVar1 = (int *)((long)&p_Var2[1]._M_next + 4);
              *piVar1 = *piVar1 + 1;
              local_50.index = (*this->_vptr_Sudoku[7])(this,(ulong)uVar5,(ulong)local_70);
              local_50.posZ = this->current_z_;
              local_50.reason = onlyPositionInColumn;
              local_50.posX = uVar5;
              local_50.posY = local_70;
              local_50.value = i;
              std::
              _Rb_tree<Sudoku::FurtherWays::Way,Sudoku::FurtherWays::Way,std::_Identity<Sudoku::FurtherWays::Way>,std::less<Sudoku::FurtherWays::Way>,std::allocator<Sudoku::FurtherWays::Way>>
              ::_M_insert_unique<Sudoku::FurtherWays::Way_const&>
                        ((_Rb_tree<Sudoku::FurtherWays::Way,Sudoku::FurtherWays::Way,std::_Identity<Sudoku::FurtherWays::Way>,std::less<Sudoku::FurtherWays::Way>,std::allocator<Sudoku::FurtherWays::Way>>
                          *)&p_Var2[2]._M_prev,&local_50);
              if (!recordFullFurtherWays) {
                iVar4 = (*this->_vptr_Sudoku[7])(this,(ulong)uVar5,(ulong)local_70);
                Field::setValue((testFields->
                                super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[iVar4].
                                super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,i);
                uVar5 = 1;
                goto LAB_0010c7e9;
              }
            }
          }
LAB_0010c7a3:
          iVar4 = this->squared_size_;
          bVar3 = i < iVar4;
          i = i + 1;
        } while (bVar3);
      }
      uVar5 = uVar5 + 1;
    } while ((int)uVar5 < iVar4);
    uVar5 = 0;
  }
LAB_0010c7e9:
  return SUB41(uVar5,0);
}

Assistant:

bool Sudoku::columnCheck(std::list<FurtherWays> &furtherWays_, std::vector<std::shared_ptr<Field>> &testFields, bool recordFullFurtherWays, bool debug)
{
  bool restart = false;

  //check columns, if there are values that can only be at one position
  restart = false;
  for (int x = 0; x < squared_size_; x++)
  {

    for (int value = 1; value <= squared_size_; value++)
    {
      bool valueIsAlreadySet = false;
      int nPossiblePositionsForValue = 0;
      int positionY = 0;
      for (int y = 0; y < squared_size_; y++)
      {
        if(testFields[index(x,y)]->value() == value)
        {
          valueIsAlreadySet = true;
          break;
        }

        if(testFields[index(x,y)]->valuePossible(value))
        {
          nPossiblePositionsForValue++;
          positionY = y;
        }
        if(nPossiblePositionsForValue > 1)
          break;
      }

      //if Value can only be at one position, set it there
      if(nPossiblePositionsForValue == 1 && !valueIsAlreadySet)
      {
        if(debug)
          std::cout<<"Column check (column "<<x<<"): value "<<value<<" has to be in field ("<<x<<","<<positionY<<","<<current_z_<<")"<<std::endl;

        furtherWays_.back().nColumnCheckMatches++;
        furtherWays_.back().addWay(index(x,positionY), x, positionY, current_z_, value, FurtherWays::Reason::onlyPositionInColumn);

        if(!recordFullFurtherWays)
        {
          testFields[index(x,positionY)]->setValue(value);
          restart = true;
          break;
        }
      }
    }
    if(restart)
      break;
  }

  return restart;
}